

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O0

uint __thiscall
Assimp::glTF2Exporter::ExportNode(glTF2Exporter *this,aiNode *n,Ref<glTF2::Node> *parent)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  element_type *peVar4;
  char *__s;
  Node *pNVar5;
  Ref<glTF2::Node> RVar6;
  Ref<glTF2::Mesh> RVar7;
  value_type local_d8;
  uint local_c8;
  uint local_c4;
  uint idx;
  uint i_1;
  uint local_b8;
  value_type local_b0;
  uint local_9c;
  vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *pvStack_98;
  uint i;
  uint local_90;
  undefined1 local_88 [8];
  Ref<glTF2::Node> node;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string name;
  Ref<glTF2::Node> *parent_local;
  aiNode *n_local;
  glTF2Exporter *this_local;
  
  name.field_2._8_8_ = parent;
  peVar4 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->mAsset);
  __s = aiString::C_Str(&n->mName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
  glTF2::Asset::FindUniqueID((string *)local_40,peVar4,&local_60,"node");
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  peVar4 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->mAsset);
  RVar6 = glTF2::LazyDict<glTF2::Node>::Create(&peVar4->nodes,(string *)local_40);
  uVar1 = name.field_2._8_8_;
  pvStack_98 = RVar6.vector;
  local_90 = RVar6.index;
  local_88 = (undefined1  [8])pvStack_98;
  node.vector._0_4_ = local_90;
  pNVar5 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_88);
  (pNVar5->parent).index = *(uint *)(uVar1 + 8);
  (pNVar5->parent).vector = *(vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> **)uVar1;
  pNVar5 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_88);
  std::__cxx11::string::operator=((string *)&(pNVar5->super_Object).name,(string *)local_40);
  bVar2 = aiMatrix4x4t<float>::IsIdentity(&n->mTransformation);
  if (!bVar2) {
    pNVar5 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_88);
    (pNVar5->matrix).isPresent = true;
    pNVar5 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_88);
    CopyValue(&n->mTransformation,(pNVar5->matrix).value);
  }
  for (local_9c = 0; local_9c < n->mNumMeshes; local_9c = local_9c + 1) {
    pNVar5 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_88);
    peVar4 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    RVar7 = glTF2::LazyDict<glTF2::Mesh>::Get(&peVar4->meshes,n->mMeshes[local_9c]);
    _idx = RVar7.vector;
    local_b8 = RVar7.index;
    local_b0.vector = _idx;
    local_b0.index = local_b8;
    std::vector<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>::push_back
              (&pNVar5->meshes,&local_b0);
  }
  for (local_c4 = 0; local_c4 < n->mNumChildren; local_c4 = local_c4 + 1) {
    local_c8 = ExportNode(this,n->mChildren[local_c4],(Ref<glTF2::Node> *)local_88);
    pNVar5 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_88);
    peVar4 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    RVar6 = glTF2::LazyDict<glTF2::Node>::Get(&peVar4->nodes,local_c8);
    local_d8.vector = RVar6.vector;
    local_d8.index = RVar6.index;
    std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::push_back
              (&pNVar5->children,&local_d8);
  }
  uVar3 = glTF2::Ref<glTF2::Node>::GetIndex((Ref<glTF2::Node> *)local_88);
  std::__cxx11::string::~string((string *)local_40);
  return uVar3;
}

Assistant:

unsigned int glTF2Exporter::ExportNode(const aiNode* n, Ref<Node>& parent)
{
    std::string name = mAsset->FindUniqueID(n->mName.C_Str(), "node");
    Ref<Node> node = mAsset->nodes.Create(name);

    node->parent = parent;
    node->name = name;

    if (!n->mTransformation.IsIdentity()) {
        node->matrix.isPresent = true;
        CopyValue(n->mTransformation, node->matrix.value);
    }

    for (unsigned int i = 0; i < n->mNumMeshes; ++i) {
        node->meshes.push_back(mAsset->meshes.Get(n->mMeshes[i]));
    }

    for (unsigned int i = 0; i < n->mNumChildren; ++i) {
        unsigned int idx = ExportNode(n->mChildren[i], node);
        node->children.push_back(mAsset->nodes.Get(idx));
    }

    return node.GetIndex();
}